

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::applyFilenamesAsTags(IConfig *config)

{
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *this;
  TestCase *pTVar1;
  value_type local_f8 [32];
  string local_d8 [32];
  long local_b8;
  size_type lastDot;
  long local_90;
  size_type lastSlash;
  string local_78 [8];
  string filename;
  undefined1 local_58 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  TestCase *test;
  size_t i;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *tests;
  IConfig *config_local;
  
  this = getAllTestCasesSorted(config);
  test = (TestCase *)0x0;
  while( true ) {
    pTVar1 = (TestCase *)std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size(this);
    if (pTVar1 <= test) break;
    tags._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::operator[]
                           (this,(size_type)test);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_58,
          &(((const_reference)tags._M_t._M_impl.super__Rb_tree_header._M_node_count)->
           super_TestCaseInfo).tags);
    std::__cxx11::string::string
              (local_78,(string *)(tags._M_t._M_impl.super__Rb_tree_header._M_node_count + 0xe0));
    local_90 = std::__cxx11::string::find_last_of((char *)local_78,0x29d967);
    if (local_90 != -1) {
      std::__cxx11::string::substr((ulong)&lastDot,(ulong)local_78);
      std::__cxx11::string::operator=(local_78,(string *)&lastDot);
      std::__cxx11::string::~string((string *)&lastDot);
    }
    local_b8 = std::__cxx11::string::find_last_of((char *)local_78,0x29ee52);
    if (local_b8 != -1) {
      std::__cxx11::string::substr((ulong)local_d8,(ulong)local_78);
      std::__cxx11::string::operator=(local_78,local_d8);
      std::__cxx11::string::~string(local_d8);
    }
    std::operator+((char *)local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x29e103);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_58,local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    setTags((TestCaseInfo *)tags._M_t._M_impl.super__Rb_tree_header._M_node_count,
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
    std::__cxx11::string::~string(local_78);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_58);
    test = (TestCase *)&(test->super_TestCaseInfo).field_0x1;
  }
  return;
}

Assistant:

void applyFilenamesAsTags( IConfig const& config ) {
        std::vector<TestCase> const& tests = getAllTestCasesSorted( config );
        for(std::size_t i = 0; i < tests.size(); ++i ) {
            TestCase& test = const_cast<TestCase&>( tests[i] );
            std::set<std::string> tags = test.tags;

            std::string filename = test.lineInfo.file;
            std::string::size_type lastSlash = filename.find_last_of( "\\/" );
            if( lastSlash != std::string::npos )
                filename = filename.substr( lastSlash+1 );

            std::string::size_type lastDot = filename.find_last_of( "." );
            if( lastDot != std::string::npos )
                filename = filename.substr( 0, lastDot );

            tags.insert( "#" + filename );
            setTags( test, tags );
        }
    }